

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::LogText(char *fmt,...)

{
  ImGuiTextBuffer *this;
  int iVar1;
  char *pcVar2;
  ImGuiContext *pIVar3;
  char in_AL;
  int iVar4;
  char *pcVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag local_f8;
  undefined1 local_d8 [8];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  pIVar3 = GImGui;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  if (GImGui->LogEnabled == true) {
    local_f8.reg_save_area = local_d8;
    local_f8.overflow_arg_area = &args[0].overflow_arg_area;
    local_f8.gp_offset = 8;
    local_f8.fp_offset = 0x30;
    this = &GImGui->LogBuffer;
    local_d0 = in_RSI;
    local_c8 = in_RDX;
    local_c0 = in_RCX;
    local_b8 = in_R8;
    local_b0 = in_R9;
    if (GImGui->LogFile == (ImFileHandle)0x0) {
      ImGuiTextBuffer::appendfv(this,fmt,&local_f8);
    }
    else {
      if ((GImGui->LogBuffer).Buf.Capacity < 0) {
        pcVar5 = (char *)MemAlloc(0);
        pcVar2 = (pIVar3->LogBuffer).Buf.Data;
        if (pcVar2 != (char *)0x0) {
          memcpy(pcVar5,pcVar2,(long)(pIVar3->LogBuffer).Buf.Size);
          MemFree((pIVar3->LogBuffer).Buf.Data);
        }
        (pIVar3->LogBuffer).Buf.Data = pcVar5;
        (pIVar3->LogBuffer).Buf.Capacity = 0;
      }
      (pIVar3->LogBuffer).Buf.Size = 0;
      ImGuiTextBuffer::appendfv(this,fmt,&local_f8);
      pcVar2 = (pIVar3->LogBuffer).Buf.Data;
      pcVar5 = ImGuiTextBuffer::EmptyString;
      if (pcVar2 != (char *)0x0) {
        pcVar5 = pcVar2;
      }
      iVar1 = (pIVar3->LogBuffer).Buf.Size;
      iVar4 = iVar1 + -1;
      if (iVar1 == 0) {
        iVar4 = 0;
      }
      fwrite(pcVar5,1,(long)iVar4,(FILE *)pIVar3->LogFile);
    }
  }
  return;
}

Assistant:

void ImGui::LogText(const char* fmt, ...)
{
    ImGuiContext& g = *GImGui;
    if (!g.LogEnabled)
        return;

    va_list args;
    va_start(args, fmt);
    LogTextV(g, fmt, args);
    va_end(args);
}